

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O2

_Bool build_offset_decode_table
                (libdeflate_decompressor *d,uint num_litlen_syms,uint num_offset_syms)

{
  _Bool _Var1;
  
  _Var1 = build_decode_table(d->offset_decode_table,(d->u).precode_lens + num_litlen_syms,
                             num_offset_syms,offset_decode_results,8,0xf,d->sorted_syms,(uint *)0x0)
  ;
  return _Var1;
}

Assistant:

static bool
build_offset_decode_table(struct libdeflate_decompressor *d,
			  unsigned num_litlen_syms, unsigned num_offset_syms)
{
	/* When you change TABLEBITS, you must change ENOUGH, and vice versa! */
	STATIC_ASSERT(OFFSET_TABLEBITS == 8 && OFFSET_ENOUGH == 402);

	STATIC_ASSERT(ARRAY_LEN(offset_decode_results) ==
		      DEFLATE_NUM_OFFSET_SYMS);

	return build_decode_table(d->offset_decode_table,
				  d->u.l.lens + num_litlen_syms,
				  num_offset_syms,
				  offset_decode_results,
				  OFFSET_TABLEBITS,
				  DEFLATE_MAX_OFFSET_CODEWORD_LEN,
				  d->sorted_syms,
				  NULL);
}